

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void RangeEnc_ShiftLow(CPpmd7z_RangeEnc *p)

{
  int iVar1;
  ulong uVar2;
  ulong *in_RDI;
  Byte temp;
  byte local_9;
  
  if (((uint)*in_RDI < 0xff000000) || ((int)(*in_RDI >> 0x20) != 0)) {
    local_9 = *(byte *)((long)in_RDI + 0xc);
    do {
      uVar2 = *in_RDI >> 0x20 & 0xff;
      iVar1 = (uint)local_9 + (int)uVar2;
      (**(code **)(in_RDI[3] + 8))(in_RDI[3],(char)iVar1,uVar2,iVar1);
      local_9 = 0xff;
      uVar2 = in_RDI[2];
      in_RDI[2] = uVar2 - 1;
    } while (uVar2 - 1 != 0);
    *(char *)((long)in_RDI + 0xc) = (char)(*in_RDI >> 0x18);
  }
  in_RDI[2] = in_RDI[2] + 1;
  *in_RDI = (ulong)(uint)((int)*in_RDI << 8);
  return;
}

Assistant:

static void RangeEnc_ShiftLow(CPpmd7z_RangeEnc *p)
{
  if ((UInt32)p->Low < (UInt32)0xFF000000 || (unsigned)(p->Low >> 32) != 0)
  {
    Byte temp = p->Cache;
    do
    {
      p->Stream->Write(p->Stream, (Byte)(temp + (Byte)(p->Low >> 32)));
      temp = 0xFF;
    }
    while(--p->CacheSize != 0);
    p->Cache = (Byte)((UInt32)p->Low >> 24);
  }
  p->CacheSize++;
  p->Low = ((UInt32)p->Low << 8) & 0xFFFFFFFF;
}